

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype.cc
# Opt level: O2

bool __thiscall verona::Sequent::lhs_reduce(Sequent *this,Btype *t)

{
  bool bVar1;
  Sequent seq;
  Sequent SStack_f8;
  
  Sequent(&SStack_f8,this);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  push_back(&SStack_f8.lhs_pending,(value_type *)t);
  bVar1 = reduce(&SStack_f8);
  if (bVar1) {
    merge(&this->bounds,&SStack_f8.bounds);
  }
  ~Sequent(&SStack_f8);
  return bVar1;
}

Assistant:

bool lhs_reduce(Btype t)
    {
      Sequent seq(*this);
      seq.lhs_pending.push_back(t);

      if (!seq.reduce())
        return false;

      merge(bounds, seq.bounds);
      return true;
    }